

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_lvprintf(zt_log_ty *log,zt_log_level level,char *fmt,__va_list_tag *ap)

{
  zt_log_ctx_ty *pzVar1;
  __va_list_tag *in_RCX;
  char *in_RDX;
  zt_log_level in_ESI;
  zt_log_ty *in_RDI;
  zt_log_ctx_ty *ctx;
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  char *local_48;
  zt_log_ty *local_8;
  
  local_8 = in_RDI;
  if ((((in_RDI != (zt_log_ty *)0x0) || (local_8 = zt_log_get_logger(), local_8 != (zt_log_ty *)0x0)
       ) && (in_ESI <= local_8->level)) &&
     (local_8->vtbl->print !=
      (_func_void_zt_log_ty_ptr_zt_log_level_char_ptr_int_char_ptr_char_ptr___va_list_tag_ptr *)0x0)
     ) {
    pzVar1 = zt_log_get_ctx();
    if (pzVar1 == (zt_log_ctx_ty *)0x0) {
      local_48 = (char *)0x0;
      in_stack_ffffffffffffffac = 0;
      in_stack_ffffffffffffffa0 = (char *)0x0;
      in_stack_ffffffffffffffb0 = local_48;
    }
    else {
      in_stack_ffffffffffffffb0 = pzVar1->file;
      in_stack_ffffffffffffffac = pzVar1->line;
      in_stack_ffffffffffffffa0 = pzVar1->function;
    }
    (*local_8->vtbl->print)
              (local_8,in_ESI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa0,in_RDX,in_RCX);
  }
  zt_log_set_debug_info
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void
zt_log_lvprintf(zt_log_ty * log, zt_log_level level, const char * fmt, va_list ap) {
    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        goto EXIT;
    }

    if (level > log->level) {
        goto EXIT;
    }

    if (log->vtbl->print) {
        zt_log_ctx_ty   * ctx = zt_log_get_ctx();
        log->vtbl->print(log, level,
                         ctx ? ctx->file : NULL,
                         ctx ? ctx->line : 0,
                         ctx ? ctx->function : NULL,
                         fmt, ap);
    }

EXIT:
    /* debug info is only valid for a single call */
    zt_log_set_debug_info(NULL, -1, NULL);
}